

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

bool __thiscall
QTextStreamPrivate::scan
          (QTextStreamPrivate *this,QChar **ptr,qsizetype *length,qsizetype maxlen,
          TokenDelimiter delimiter)

{
  char16_t **ppcVar1;
  char16_t cVar2;
  QIODevice *pQVar3;
  long lVar4;
  QString *pQVar5;
  bool bVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  qsizetype *pqVar10;
  qsizetype *pqVar11;
  char16_t **ppcVar12;
  char32_t ucs4;
  long lVar13;
  char16_t *pcVar14;
  qsizetype qVar15;
  long lVar16;
  long local_78;
  ulong local_70;
  
  pqVar10 = &this->readBufferOffset;
  if (this->device == (QIODevice *)0x0) {
    pqVar10 = &this->stringOffset;
  }
  qVar15 = *pqVar10;
  ppcVar1 = &(this->readBuffer).d.ptr;
  pqVar10 = &(this->readBuffer).d.size;
  local_70 = 0;
  lVar16 = 0;
  local_78 = 0;
  do {
    pQVar3 = this->device;
    if (pQVar3 == (QIODevice *)0x0) {
      pcVar14 = (this->string->d).ptr;
      if (pcVar14 == (char16_t *)0x0) {
        pcVar14 = L"";
      }
      pqVar11 = &(this->string->d).size;
    }
    else {
      pcVar14 = *ppcVar1;
      pqVar11 = pqVar10;
      if (pcVar14 == (char16_t *)0x0) {
        pcVar14 = L"";
      }
    }
    lVar4 = *pqVar11;
    if (qVar15 < lVar4) {
      do {
        if (maxlen <= lVar16 && maxlen != 0) goto LAB_00119846;
        cVar2 = pcVar14[qVar15];
        lVar16 = lVar16 + 1;
        if (delimiter == EndOfLine) {
          if (cVar2 == L'\n') {
            lVar13 = (ulong)((short)local_70 == 0xd) + 1;
            local_70._0_2_ = 10;
            bVar8 = true;
            goto LAB_001198ae;
          }
          bVar8 = false;
          uVar7 = (ulong)(ushort)cVar2;
        }
        else {
          ucs4 = (char32_t)(ushort)cVar2;
          uVar7 = local_70;
          if (delimiter == NotSpace) {
            bVar8 = false;
            if ((4 < (ushort)cVar2 - 9) && (ucs4 != L' ')) {
              if ((uint)ucs4 < 0x80) goto LAB_001198ac;
              bVar8 = false;
              if ((ucs4 != L'\x85') && (ucs4 != L'\xa0')) {
                bVar8 = QChar::isSpace_helper(ucs4);
                if (!bVar8) {
                  local_78 = 1;
                }
                bVar8 = !bVar8;
              }
            }
          }
          else {
            if (delimiter == Space) {
              if (((uint)ucs4 < 0x21) && ((0x100003e00U >> ((ulong)(ushort)cVar2 & 0x3f) & 1) != 0))
              {
LAB_001198ac:
                lVar13 = 1;
                bVar8 = false;
                goto LAB_001198ae;
              }
              if (0x7f < (uint)ucs4) {
                bVar8 = false;
                lVar13 = 1;
                if ((ucs4 != L'\x85') && (ucs4 != L'\xa0')) {
                  bVar8 = QChar::isSpace_helper(ucs4);
                  if (bVar8) {
                    local_78 = 1;
                  }
                  goto LAB_0011982e;
                }
                goto LAB_001198ae;
              }
            }
            bVar8 = false;
          }
        }
LAB_0011982e:
        local_70 = uVar7;
        qVar15 = qVar15 + 1;
      } while ((bVar8 == false) && (qVar15 < lVar4));
      if (bVar8 != false) {
        bVar8 = false;
        lVar13 = local_78;
LAB_001198ae:
        bVar6 = true;
        goto LAB_001198b3;
      }
    }
LAB_00119846:
    if (((pQVar3 == (QIODevice *)0x0) || (maxlen != 0 && maxlen <= lVar16)) ||
       (bVar8 = fillReadBuffer(this,-1), !bVar8)) {
      bVar6 = false;
      bVar8 = false;
      lVar13 = local_78;
LAB_001198b3:
      if (lVar16 != 0) {
        if (((0 < lVar16 && delimiter == EndOfLine) && !bVar6) &&
           (((this->string != (QString *)0x0 &&
             (this->stringOffset + lVar16 == (this->string->d).size)) ||
            ((this->device != (QIODevice *)0x0 &&
             (iVar9 = (*this->device->_vptr_QIODevice[8])(), (char)iVar9 != '\0')))))) {
          lVar13 = lVar13 + (ulong)((short)local_70 == 0xd);
          bVar8 = (bool)((short)local_70 == 0xd | bVar8);
        }
        if (length != (qsizetype *)0x0) {
          *length = lVar16 - lVar13;
        }
        if (ptr != (QChar **)0x0) {
          pQVar5 = this->string;
          ppcVar12 = &(pQVar5->d).ptr;
          if (pQVar5 == (QString *)0x0) {
            ppcVar12 = ppcVar1;
          }
          pcVar14 = *ppcVar12;
          pqVar10 = &this->stringOffset;
          if (pQVar5 == (QString *)0x0) {
            pqVar10 = &this->readBufferOffset;
          }
          if (pcVar14 == (char16_t *)0x0) {
            pcVar14 = L"";
          }
          *ptr = (QChar *)(pcVar14 + *pqVar10);
        }
        if (bVar8) {
          lVar13 = 0;
        }
        this->lastTokenSize = lVar16 - lVar13;
      }
      return lVar16 != 0;
    }
  } while( true );
}

Assistant:

bool QTextStreamPrivate::scan(const QChar **ptr, qsizetype *length, qsizetype maxlen,
                              TokenDelimiter delimiter)
{
    qsizetype totalSize = 0;
    qsizetype delimSize = 0;
    bool consumeDelimiter = false;
    bool foundToken = false;
    qsizetype startOffset = device ? readBufferOffset : stringOffset;
    QChar lastChar;

    do {
        qsizetype endOffset;
        const QChar *chPtr;
        if (device) {
            chPtr = readBuffer.constData();
            endOffset = readBuffer.size();
        } else {
            chPtr = string->constData();
            endOffset = string->size();
        }
        chPtr += startOffset;

        for (; !foundToken && startOffset < endOffset && (!maxlen || totalSize < maxlen); ++startOffset) {
            const QChar ch = *chPtr++;
            ++totalSize;

            switch (delimiter) {
            case Space:
                if (ch.isSpace()) {
                    foundToken = true;
                    delimSize = 1;
                }
                break;
            case NotSpace:
                if (!ch.isSpace()) {
                    foundToken = true;
                    delimSize = 1;
                }
                break;
            case EndOfLine:
                if (ch == u'\n') {
                    foundToken = true;
                    delimSize = (lastChar == u'\r') ? 2 : 1;
                    consumeDelimiter = true;
                }
                lastChar = ch;
                break;
            }
        }
    } while (!foundToken
             && (!maxlen || totalSize < maxlen)
             && device && fillReadBuffer());

    if (totalSize == 0) {
#if defined (QTEXTSTREAM_DEBUG)
        qDebug("QTextStreamPrivate::scan() reached the end of input.");
#endif
        return false;
    }

    // if we find a '\r' at the end of the data when reading lines,
    // don't make it part of the line.
    if (delimiter == EndOfLine && totalSize > 0 && !foundToken) {
        if (((string && stringOffset + totalSize == string->size()) || (device && device->atEnd()))
            && lastChar == u'\r') {
            consumeDelimiter = true;
            ++delimSize;
        }
    }

    // set the read offset and length of the token
    if (length)
        *length = totalSize - delimSize;
    if (ptr)
        *ptr = readPtr();

    // update last token size. the callee will call consumeLastToken() when
    // done.
    lastTokenSize = totalSize;
    if (!consumeDelimiter)
        lastTokenSize -= delimSize;

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::scan(%p, %p, %d, %x) token length = %d, delimiter = %d",
           ptr, length, int(maxlen), uint(delimiter), int(totalSize - delimSize), int(delimSize));
#endif
    return true;
}